

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ImGuiWindow **ppIVar6;
  ulong uVar7;
  ulong uVar8;
  ImGuiWindow **ppIVar9;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar4 = (ulong)uVar1;
  if (uVar4 != 0) {
    uVar5 = 0;
    if ((ref_window == (ImGuiWindow *)0x0) || ((int)uVar1 < 1)) {
LAB_001174d1:
      if ((int)uVar5 < (int)uVar1) {
        ClosePopupToLevel((int)uVar5,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      pIVar2 = (GImGui->OpenPopupStack).Data;
      ppIVar6 = &pIVar2->Window;
      uVar5 = 0;
      uVar7 = uVar4;
      do {
        pIVar3 = pIVar2[uVar5].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) &&
           (uVar8 = uVar7, ppIVar9 = ppIVar6, (pIVar3->Flags & 0x1000000) == 0)) {
          while ((*ppIVar9 == (ImGuiWindow *)0x0 ||
                 ((*ppIVar9)->RootWindow != ref_window->RootWindow))) {
            uVar8 = uVar8 - 1;
            ppIVar9 = ppIVar9 + 6;
            if (uVar8 == 0) goto LAB_001174d1;
          }
        }
        uVar5 = uVar5 + 1;
        ppIVar6 = ppIVar6 + 6;
        uVar7 = uVar7 - 1;
      } while (uVar5 != uVar4);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}